

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ScopedNameSyntax::setChild(ScopedNameSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index == 2) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::NameSyntax>(pSVar1);
    }
    not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
              ((not_null<slang::syntax::NameSyntax*> *)&local_b8,(NameSyntax **)&local_d8);
    (this->right).ptr = (NameSyntax *)local_b8._M_dataplus._M_p;
  }
  else if (index == 1) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->separator).kind = TVar2.kind;
    (this->separator).field_0x2 = TVar2._2_1_;
    (this->separator).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->separator).rawLen = TVar2.rawLen;
    (this->separator).info = TVar2.info;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_58,&local_78,":");
      std::__cxx11::to_string(&local_98,0x2cea);
      std::operator+(&local_38,&local_58,&local_98);
      std::operator+(&local_d8,&local_38,": ");
      std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_b8);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::NameSyntax>(pSVar1);
    }
    not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
              ((not_null<slang::syntax::NameSyntax*> *)&local_b8,(NameSyntax **)&local_d8);
    (this->left).ptr = (NameSyntax *)local_b8._M_dataplus._M_p;
  }
  return;
}

Assistant:

void ScopedNameSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: left = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 1: separator = child.token(); return;
        case 2: right = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}